

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O0

int SSL_request_handshake_hints
              (SSL *ssl,uint8_t *client_hello,size_t client_hello_len,uint8_t *capabilities,
              size_t capabilities_len)

{
  SSL3_STATE *pSVar1;
  _func_bool_SSL_ptr_CBB_ptr_CBB_ptr_uint8_t *p_Var2;
  _func_bool_SSL_ptr_CBB_ptr_Array<unsigned_char>_ptr *p_Var3;
  bool bVar4;
  int iVar5;
  cbb_st *pcVar6;
  BUF_MEM *__p;
  pointer buf;
  uchar *in;
  size_t len;
  pointer pSVar7;
  undefined1 local_e8 [8];
  CBB client_hello_body;
  ScopedCBB client_hello_cbb;
  Array<unsigned_char> client_hello_msg;
  SSL3_STATE *s3;
  unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter> local_60;
  UniquePtr<SSL_HANDSHAKE_HINTS> hints;
  CBS seq;
  CBS cbs;
  size_t capabilities_len_local;
  uint8_t *capabilities_local;
  size_t client_hello_len_local;
  uint8_t *client_hello_local;
  SSL *ssl_local;
  
  iVar5 = SSL_is_dtls(ssl);
  if (iVar5 != 0) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                  ,0x318);
    return 0;
  }
  CBS_init((CBS *)&seq.len,capabilities,capabilities_len);
  bssl::MakeUnique<bssl::SSL_HANDSHAKE_HINTS>();
  bVar4 = std::operator==(&local_60,(nullptr_t)0x0);
  if (((bVar4) || (iVar5 = CBS_get_asn1((CBS *)&seq.len,(CBS *)&hints,0x20000010), iVar5 == 0)) ||
     (bVar4 = bssl::apply_remote_features(ssl,(CBS *)&hints), !bVar4)) {
    ssl_local._4_4_ = 0;
    goto LAB_00348f35;
  }
  pSVar1 = ssl->s3;
  *(ushort *)&pSVar1->field_0xdc = *(ushort *)&pSVar1->field_0xdc | 2;
  *(ushort *)&pSVar1->field_0xdc = *(ushort *)&pSVar1->field_0xdc | 8;
  bssl::Array<unsigned_char>::Array((Array<unsigned_char> *)((long)&client_hello_cbb.ctx_.u + 0x18))
  ;
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
             ((long)&client_hello_body.u + 0x18));
  p_Var2 = ssl->method->init_message;
  pcVar6 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                      ((long)&client_hello_body.u + 0x18));
  bVar4 = (*p_Var2)(ssl,pcVar6,(CBB *)local_e8,'\x01');
  if ((bVar4) && (iVar5 = CBB_add_bytes((CBB *)local_e8,client_hello,client_hello_len), iVar5 != 0))
  {
    p_Var3 = ssl->method->finish_message;
    pcVar6 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&client_hello_body.u + 0x18));
    bVar4 = (*p_Var3)(ssl,pcVar6,(Array<unsigned_char> *)((long)&client_hello_cbb.ctx_.u + 0x18));
    if (!bVar4) goto LAB_00348db9;
    __p = BUF_MEM_new();
    std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::reset(&pSVar1->hs_buf,(pointer)__p);
    bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pSVar1->hs_buf);
    if (bVar4) {
      buf = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get(&pSVar1->hs_buf);
      in = bssl::Array<unsigned_char>::data
                     ((Array<unsigned_char> *)((long)&client_hello_cbb.ctx_.u + 0x18));
      len = bssl::Array<unsigned_char>::size
                      ((Array<unsigned_char> *)((long)&client_hello_cbb.ctx_.u + 0x18));
      iVar5 = BUF_MEM_append(buf,in,len);
      if (iVar5 == 0) goto LAB_00348eaa;
      pSVar7 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                         (&pSVar1->hs);
      *(uint *)&pSVar7->field_0x6c8 = *(uint *)&pSVar7->field_0x6c8 & 0xffefffff | 0x100000;
      pSVar7 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                         (&pSVar1->hs);
      std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::operator=
                (&pSVar7->hints,&local_60);
      ssl_local._4_4_ = 1;
    }
    else {
LAB_00348eaa:
      ssl_local._4_4_ = 0;
    }
  }
  else {
LAB_00348db9:
    ssl_local._4_4_ = 0;
  }
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
             ((long)&client_hello_body.u + 0x18));
  bssl::Array<unsigned_char>::~Array
            ((Array<unsigned_char> *)((long)&client_hello_cbb.ctx_.u + 0x18));
LAB_00348f35:
  std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::~unique_ptr(&local_60);
  return ssl_local._4_4_;
}

Assistant:

int SSL_request_handshake_hints(SSL *ssl, const uint8_t *client_hello,
                                size_t client_hello_len,
                                const uint8_t *capabilities,
                                size_t capabilities_len) {
  if (SSL_is_dtls(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  CBS cbs, seq;
  CBS_init(&cbs, capabilities, capabilities_len);
  UniquePtr<SSL_HANDSHAKE_HINTS> hints = MakeUnique<SSL_HANDSHAKE_HINTS>();
  if (hints == nullptr ||                              //
      !CBS_get_asn1(&cbs, &seq, CBS_ASN1_SEQUENCE) ||  //
      !apply_remote_features(ssl, &seq)) {
    return 0;
  }

  SSL3_STATE *const s3 = ssl->s3;
  s3->v2_hello_done = true;
  s3->has_message = true;

  Array<uint8_t> client_hello_msg;
  ScopedCBB client_hello_cbb;
  CBB client_hello_body;
  if (!ssl->method->init_message(ssl, client_hello_cbb.get(),
                                 &client_hello_body, SSL3_MT_CLIENT_HELLO) ||
      !CBB_add_bytes(&client_hello_body, client_hello, client_hello_len) ||
      !ssl->method->finish_message(ssl, client_hello_cbb.get(),
                                   &client_hello_msg)) {
    return 0;
  }

  s3->hs_buf.reset(BUF_MEM_new());
  if (!s3->hs_buf || !BUF_MEM_append(s3->hs_buf.get(), client_hello_msg.data(),
                                     client_hello_msg.size())) {
    return 0;
  }

  s3->hs->hints_requested = true;
  s3->hs->hints = std::move(hints);
  return 1;
}